

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-grib-cursor.c
# Opt level: O0

int coda_grib_cursor_read_float(coda_cursor_conflict *cursor,float *dst)

{
  int iVar1;
  long lVar2;
  double dVar3;
  long local_60;
  long i;
  long value_index;
  long bm_index;
  uint8_t bm;
  uint8_t *buffer;
  int64_t ivalue;
  long index;
  coda_grib_value_array *array;
  float *dst_local;
  coda_cursor_conflict *cursor_local;
  
  array = (coda_grib_value_array *)dst;
  dst_local = (float *)cursor;
  if (cursor->n < 2) {
    __assert_fail("cursor->n > 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x90,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  index = (long)cursor->stack[cursor->n + -2].type;
  if (((coda_dynamic_type_struct *)index)->definition->type_class != coda_array_class) {
    __assert_fail("array->definition->type_class == coda_array_class",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-grib-cursor.c"
                  ,0x92,"int coda_grib_cursor_read_float(const coda_cursor *, float *)");
  }
  ivalue = cursor->stack[cursor->n + -1].index;
  if (*(int *)&((coda_dynamic_type_struct *)(index + 0x20))->definition == 0) {
    iVar1 = read_bytes((coda_product *)cursor->product[1].filename,
                       (*(long *)(index + 0x20) >> 3) + ivalue * 4,4,dst);
    if (iVar1 != 0) {
      return -1;
    }
    swap4(array);
  }
  else {
    buffer = (uint8_t *)0x0;
    if (*(int *)((long)&((coda_dynamic_type_struct *)(index + 0x20))->definition + 4) == 0) {
      *dst = *(float *)&((coda_dynamic_type_struct *)(index + 0x30))->field_0x4;
      return 0;
    }
    if (((coda_dynamic_type_struct *)(index + 0x40))->definition != (coda_type *)0x0) {
      i = 0;
      lVar2 = ivalue >> 3;
      if (((int)(uint)*(byte *)((long)&((coda_dynamic_type_struct *)(index + 0x40))->definition->
                                       format + lVar2) >> (7 - ((byte)ivalue & 7) & 0x1f) & 1U) == 0
         ) {
        dVar3 = coda_NaN();
        array->backend = (coda_backend)(float)dVar3;
        return 0;
      }
      for (local_60 = 0; local_60 < ivalue >> 7; local_60 = local_60 + 1) {
        i = (ulong)*(byte *)(*(long *)(index + 0x50) + 0xf + local_60 * 0x10) + i;
      }
      if (lVar2 % 0x10 != 0) {
        i = (ulong)*(byte *)(*(long *)(index + 0x50) + lVar2 + -1) + i;
      }
      for (local_60 = 0; local_60 < (long)(ivalue & 7U); local_60 = local_60 + 1) {
        i = (int)((int)(uint)*(byte *)((long)&((coda_dynamic_type_struct *)(index + 0x40))->
                                              definition->format + lVar2) >>
                  (7U - (char)local_60 & 0x1f) & 1) + i;
      }
      ivalue = i;
    }
    iVar1 = read_bits((coda_product *)cursor->product[1].filename,
                      *(long *)(index + 0x20) +
                      ivalue * *(int *)((long)&((coda_dynamic_type_struct *)(index + 0x20))->
                                               definition + 4),
                      (long)*(int *)((long)&((coda_dynamic_type_struct *)(index + 0x20))->definition
                                    + 4),
                      (uint8_t *)
                      ((long)&buffer +
                      (long)(int)(8 - ((*(int *)((long)&((coda_dynamic_type_struct *)(index + 0x20))
                                                        ->definition + 4) >> 3) +
                                      (uint)(((ulong)((coda_dynamic_type_struct *)(index + 0x20))->
                                                     definition & 0x700000000) != 0)))));
    if (iVar1 != 0) {
      return -1;
    }
    swap8(&buffer);
    array->backend =
         (coda_backend)
         (float)((double)(long)buffer * *(double *)(index + 0x38) + *(double *)(index + 0x40));
  }
  return 0;
}

Assistant:

int coda_grib_cursor_read_float(const coda_cursor *cursor, float *dst)
{
    coda_grib_value_array *array;
    long index;

    assert(cursor->n > 1);
    array = (coda_grib_value_array *)cursor->stack[cursor->n - 2].type;
    assert(array->definition->type_class == coda_array_class);
    index = cursor->stack[cursor->n - 1].index;
    if (array->simple_packing)
    {
        int64_t ivalue = 0;
        uint8_t *buffer;

        if (array->element_bit_size == 0)
        {
            *((float *)dst) = array->referenceValue;
            return 0;
        }
        if (array->bitmask != NULL)
        {
            uint8_t bm;
            long bm_index;
            long value_index = 0;
            long i;

            bm_index = index >> 3;
            bm = array->bitmask[bm_index];
            if (!((bm >> (7 - (index & 0x7))) & 1))
            {
                /* bitmask value is 0 -> return NaN */
                *((float *)dst) = (float)coda_NaN();
                return 0;
            }

            /* bitmask value is 1 -> update index to be the index in the value array */
            for (i = 0; i < bm_index >> 4; i++)
            {
                /* advance value_index based on cumsum of blocks of 128 bitmap bits (= 16 bytes) */
                value_index += array->bitmask_cumsum128[16 * i + 15];
            }
            if (bm_index % 16 != 0)
            {
                value_index += array->bitmask_cumsum128[bm_index - 1];
            }
            bm = array->bitmask[bm_index];
            for (i = 0; i < (index & 0x7); i++)
            {
                value_index += (bm >> (7 - i)) & 1;
            }
            index = value_index;
        }
        buffer = &((uint8_t *)&ivalue)[8 - bit_size_to_byte_size(array->element_bit_size)];
        if (read_bits(((coda_grib_product *)cursor->product)->raw_product,
                      array->bit_offset + index * array->element_bit_size, array->element_bit_size, buffer) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap8(&ivalue);
#endif
        *((float *)dst) = (float)(ivalue * array->scalefactor + array->offset);
    }
    else
    {
        if (read_bytes(((coda_grib_product *)cursor->product)->raw_product, (array->bit_offset >> 3) + index * 4, 4,
                       dst) != 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_float(dst);
#endif
    }

    return 0;
}